

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O1

char * foreach_value_variable(char *name,char *item)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  pcVar3 = bc_strdup_printf("%s__%s",name,item);
  cVar1 = *pcVar3;
  pcVar2 = pcVar3;
  while (cVar1 != '\0') {
    if (0x19 < (byte)(cVar1 + 0xbfU) && 9 < (byte)(cVar1 - 0x30U)) {
      cVar4 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar4 = '_';
      }
      *pcVar2 = cVar4;
    }
    cVar1 = pcVar2[1];
    pcVar2 = pcVar2 + 1;
  }
  return pcVar3;
}

Assistant:

static char*
foreach_value_variable(const char *name, const char *item)
{
    if (name == NULL || item == NULL)
        return NULL;

    char *rv = bc_strdup_printf("%s__%s", name, item);
    int diff = 'a' - 'A';  // just to avoid magic numbers
    for (size_t i = 0; rv[i] != '\0'; i++) {
        if ((rv[i] >= '0' && rv[i] <= '9') ||
            (rv[i] >= 'A' && rv[i] <= 'Z')) {
            continue;
        }
        if (rv[i] >= 'a' && rv[i] <= 'z') {
            rv[i] -= diff;
            continue;
        }
        rv[i] = '_';
    }

    return rv;
}